

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticsReporter_Parser.cpp
# Opt level: O2

void __thiscall
psy::C::Parser::DiagnosticsReporter::ExpectedFollowOfStructDeclarator(DiagnosticsReporter *this)

{
  SyntaxToken *this_00;
  char *__rhs;
  vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *validTkKinds;
  initializer_list<psy::C::SyntaxKind> __l;
  allocator_type local_171;
  undefined1 local_170 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string s;
  DiagnosticDescriptor local_70;
  
  local_170._26_4_ = 0x1d0064;
  local_170._30_2_ = 0x57;
  __l._M_len = 3;
  __l._M_array = (iterator)(local_170 + 0x1a);
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::vector
            ((vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)local_170,__l,
             &local_171);
  joinTokenNames_abi_cxx11_(&local_d0,(DiagnosticsReporter *)local_170,validTkKinds);
  std::operator+(&local_b0,"expected ",&local_d0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_170 + 0x20),&local_b0,"after field declarator, got `");
  this_00 = peek(this->parser_,1);
  __rhs = SyntaxToken::valueText_c_str(this_00);
  std::operator+(&local_70.id_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_170 + 0x20),__rhs);
  std::operator+(&s,&local_70.id_,"\'");
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)(local_170 + 0x20));
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::_Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::~_Vector_base
            ((_Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)local_170);
  std::__cxx11::string::string
            (local_f0,(string *)&ID_of_ExpectedFollowOfStructDeclarator_abi_cxx11_);
  std::__cxx11::string::string<std::allocator<char>>
            (local_110,"[[unexpected Follow of field declarator]]",
             (allocator<char> *)(local_170 + 0x20));
  std::__cxx11::string::string(local_130,(string *)&s);
  psy::DiagnosticDescriptor::DiagnosticDescriptor(&local_70,local_f0,local_110,local_130,2,1);
  diagnoseOrDelayDiagnostic(this,&local_70);
  DiagnosticDescriptor::~DiagnosticDescriptor(&local_70);
  std::__cxx11::string::~string(local_130);
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::~string((string *)&s);
  return;
}

Assistant:

void Parser::DiagnosticsReporter::ExpectedFollowOfStructDeclarator()
{
    auto validTkKinds = { SyntaxKind::CommaToken,
                          SyntaxKind::SemicolonToken,
                          SyntaxKind::ColonToken };

    std::string s = "expected "
            + joinTokenNames(validTkKinds)
            + "after field declarator, got `"
            + parser_->peek().valueText_c_str()
            + "'";

    diagnoseOrDelayDiagnostic(
                DiagnosticDescriptor(ID_of_ExpectedFollowOfStructDeclarator,
                                     "[[unexpected Follow of field declarator]]",
                                     s,
                                     DiagnosticSeverity::Error,
                                     DiagnosticCategory::Syntax));
}